

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

PolicyStatus __thiscall cmState::Snapshot::GetPolicy(Snapshot *this,PolicyID id)

{
  cmLinkedTree<cmState::PolicyStackEntry> *pcVar1;
  iterator other;
  bool bVar2;
  PolicyStatus PVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pPVar6;
  iterator other_00;
  undefined1 local_80 [8];
  PositionType p;
  PositionType e;
  iterator root;
  iterator leaf;
  iterator dir;
  PolicyStatus status;
  PolicyID id_local;
  Snapshot *this_local;
  
  PVar3 = cmPolicies::GetPolicyStatus(id);
  if ((PVar3 != REQUIRED_ALWAYS) && (PVar3 != REQUIRED_IF_USED)) {
    pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    leaf.Position = (PositionType)(pSVar4->BuildSystemDirectory).Tree;
    while( true ) {
      bVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::IsValid
                        ((iterator *)&leaf.Position);
      if (!bVar2) {
        __assert_fail("dir.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                      ,0x4f5,
                      "cmPolicies::PolicyStatus cmState::Snapshot::GetPolicy(cmPolicies::PolicyID) const"
                     );
      }
      pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&leaf.Position);
      pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pBVar5->DirectoryEnd);
      root.Position = (PositionType)(pSVar4->Policies).Tree;
      leaf.Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)(pSVar4->Policies).Position;
      pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&leaf.Position);
      pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pBVar5->DirectoryEnd);
      pcVar1 = (pSVar4->PolicyRoot).Tree;
      root.Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)(pSVar4->PolicyRoot).Position;
      while (other.Position = (PositionType)root.Tree, other.Tree = pcVar1,
            bVar2 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator!=
                              ((iterator *)&root.Position,other), bVar2) {
        pPVar6 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->
                           ((iterator *)&root.Position);
        bVar2 = cmPolicies::PolicyMap::IsDefined(&pPVar6->super_PolicyMap,id);
        if (bVar2) {
          pPVar6 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->
                             ((iterator *)&root.Position);
          PVar3 = cmPolicies::PolicyMap::Get(&pPVar6->super_PolicyMap,id);
          return PVar3;
        }
        cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++((iterator *)&root.Position);
      }
      pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)&leaf.Position);
      p.Position = (PositionType)(pBVar5->DirectoryEnd).Tree;
      pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                         ((iterator *)&p.Position);
      local_80 = (undefined1  [8])(pSVar4->DirectoryParent).Tree;
      p.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)(pSVar4->DirectoryParent).Position;
      other_00 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->State->SnapshotData);
      bVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==
                        ((iterator *)local_80,other_00);
      if (bVar2) break;
      pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_80);
      leaf.Position = (PositionType)(pSVar4->BuildSystemDirectory).Tree;
    }
  }
  return PVar3;
}

Assistant:

cmPolicies::PolicyStatus
cmState::Snapshot::GetPolicy(cmPolicies::PolicyID id) const
{
  cmPolicies::PolicyStatus status = cmPolicies::GetPolicyStatus(id);

  if(status == cmPolicies::REQUIRED_ALWAYS ||
     status == cmPolicies::REQUIRED_IF_USED)
    {
    return status;
    }

  cmLinkedTree<BuildsystemDirectoryStateType>::iterator dir =
      this->Position->BuildSystemDirectory;

  while (true)
    {
    assert(dir.IsValid());
    cmLinkedTree<PolicyStackEntry>::iterator leaf =
        dir->DirectoryEnd->Policies;
    cmLinkedTree<PolicyStackEntry>::iterator root =
        dir->DirectoryEnd->PolicyRoot;
    for( ; leaf != root; ++leaf)
      {
      if(leaf->IsDefined(id))
        {
        status = leaf->Get(id);
        return status;
        }
      }
    cmState::PositionType e = dir->DirectoryEnd;
    cmState::PositionType p = e->DirectoryParent;
    if (p == this->State->SnapshotData.Root())
      {
      break;
      }
    dir = p->BuildSystemDirectory;
    }
  return status;
}